

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplescene.cpp
# Opt level: O2

void __thiscall graphics101::SimpleScene::loadScene(SimpleScene *this,string *scene_path)

{
  DrawablePtr *this_00;
  ShaderProgram *pSVar1;
  _Alloc_hider __p;
  GLint position_location;
  GLint normal_location;
  GLint texcoord_location;
  char *__to;
  char *__from;
  allocator local_dc;
  allocator local_db;
  allocator local_da;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  __shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  Drawable::makePtr();
  __p._M_p = local_d8._M_dataplus._M_p;
  this_00 = &this->m_drawable;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::reset
            ((__uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_> *)
             this_00,(pointer)__p._M_p);
  std::unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>::~unique_ptr
            ((unique_ptr<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_> *)
             &local_d8);
  ShaderProgram::makePtr();
  std::__shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
             (this->m_drawable)._M_t.
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl,
             (__shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
  pSVar1 = (((this->m_drawable)._M_t.
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program).
           super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_b8,"simplest.vs",(allocator *)&local_78);
  pathRelativeToFile(&local_98,&local_b8,scene_path);
  fileAsString(&local_d8,&local_98);
  ShaderProgram::addShader(pSVar1,0x8b31,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  pSVar1 = (((this_00->_M_t).
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program).
           super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_b8,"simplest.fs",(allocator *)&local_78);
  pathRelativeToFile(&local_98,&local_b8,scene_path);
  fileAsString(&local_d8,&local_98);
  __from = (char *)0x8b30;
  ShaderProgram::addShader(pSVar1,0x8b30,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  ShaderProgram::link((((this_00->_M_t).
                        super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
                        .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->
                      program).
                      super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,__from,__to);
  std::__cxx11::string::string((string *)&local_98,"triangle.obj",&local_d9);
  pathRelativeToFile(&local_d8,&local_98,scene_path);
  pSVar1 = (((this_00->_M_t).
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program).
           super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_b8,"vPos",&local_da);
  position_location = ShaderProgram::getAttribLocation(pSVar1,&local_b8);
  pSVar1 = (((this_00->_M_t).
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program).
           super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_78,"vNormal",&local_db);
  normal_location = ShaderProgram::getAttribLocation(pSVar1,&local_78);
  pSVar1 = (((this_00->_M_t).
             super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
             ._M_t.
             super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
             .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->program).
           super___shared_ptr<graphics101::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_48,"vTexCoord",&local_dc);
  texcoord_location = ShaderProgram::getAttribLocation(pSVar1,&local_48);
  vao::makeFromOBJPath
            ((vao *)&local_58,&local_d8,true,false,position_location,normal_location,
             texcoord_location);
  std::__shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this_00->_M_t).
                super___uniq_ptr_impl<graphics101::Drawable,_std::default_delete<graphics101::Drawable>_>
                ._M_t.
                super__Tuple_impl<0UL,_graphics101::Drawable_*,_std::default_delete<graphics101::Drawable>_>
                .super__Head_base<0UL,_graphics101::Drawable_*,_false>._M_head_impl)->vao).
              super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>,
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  (*gl3wProcs.ptr[0x35])(0x3f800000,0,0,0x3f800000);
  return;
}

Assistant:

void SimpleScene::loadScene( const std::string& scene_path ) {
    
    m_drawable = Drawable::makePtr();
    
    // Make a program.
    // Everyone else expects it to have been created so we can get binding locations.
    m_drawable->program = ShaderProgram::makePtr();
    m_drawable->program->addShader( GL_VERTEX_SHADER, fileAsString( pathRelativeToFile( "simplest.vs", scene_path ) ) );
    m_drawable->program->addShader( GL_FRAGMENT_SHADER, fileAsString( pathRelativeToFile( "simplest.fs", scene_path ) ) );
    m_drawable->program->link();
    
    // Demonstration of setting a uniform programmatically.
    // m_drawable->program->setUniform( "uColor", vec3( 1.0, 1.0, 0.0 ) );
    
    m_drawable->vao = vao::makeFromOBJPath(
        pathRelativeToFile( "triangle.obj", scene_path ),
        // Create normals if needed.
        true,
        // Don't normalize.
        false,
        m_drawable->program->getAttribLocation( "vPos" ),
        m_drawable->program->getAttribLocation( "vNormal" ),
        m_drawable->program->getAttribLocation( "vTexCoord" )
        );
    
    // Finally, set the background color.
    glClearColor( 1.0, 0.0, 0.0, 1.0 );
}